

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O2

void __thiscall APowerInvulnerable::InitEffect(APowerInvulnerable *this)

{
  TObjPtr<AActor> *obj;
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  AActor *pAVar4;
  PClass *pPVar5;
  
  obj = &(this->super_APowerup).super_AInventory.Owner;
  pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
  *(byte *)&pAVar4->effects = (byte)pAVar4->effects & 0xdf;
  pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
  pbVar1 = (byte *)((long)&(pAVar4->flags2).Value + 3);
  *pbVar1 = *pbVar1 | 8;
  iVar3 = (this->super_APowerup).Mode.super_FName.Index;
  if (iVar3 == 0) {
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
    bVar2 = DObject::IsKindOf((DObject *)pAVar4,APlayerPawn::RegistrationInfo.MyClass);
    if (bVar2) {
      pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
      pPVar5 = DObject::GetClass((DObject *)pAVar4);
      iVar3 = *(int *)&pPVar5[2].super_PNativeStruct.super_PStruct.super_PNamedType.
                       super_PCompoundType.super_PType.Symbols.Symbols.Nodes;
      (this->super_APowerup).Mode.super_FName.Index = iVar3;
    }
    else {
      iVar3 = (this->super_APowerup).Mode.super_FName.Index;
    }
  }
  if (iVar3 == 0x12) {
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
    pbVar1 = (byte *)((long)&(pAVar4->flags2).Value + 3);
    *pbVar1 = *pbVar1 | 0x80;
  }
  return;
}

Assistant:

void APowerInvulnerable::InitEffect ()
{
	Super::InitEffect();
	Owner->effects &= ~FX_RESPAWNINVUL;
	Owner->flags2 |= MF2_INVULNERABLE;
	if (Mode == NAME_None && Owner->IsKindOf(RUNTIME_CLASS(APlayerPawn)))
	{
		Mode = static_cast<PClassPlayerPawn *>(Owner->GetClass())->InvulMode;
	}
	if (Mode == NAME_Reflective)
	{
		Owner->flags2 |= MF2_REFLECTIVE;
	}
}